

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

void SDL_GL_UpdateRects(int numrects,SDL12_Rect *rects12)

{
  SDL12_Rect SVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  GLenum GVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 extraout_XMM1_Qb;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  SDL_Rect intersected20;
  SDL_Rect local_58;
  SDL_Rect local_40;
  
  if (OpenGLBlitTexture != 0) {
    uVar9 = (ulong)(uint)numrects;
    uVar7 = (ulong)VideoSurface12Location.pitch;
    uVar6 = (uint)(VideoSurface12Location.format)->BytesPerPixel;
    GVar8 = 0x8363;
    if (uVar6 == 4) {
      GVar8 = 0x1401;
    }
    local_40.x = 0;
    local_40.y = 0;
    local_40.h = VideoSurface12Location.h;
    local_40.w = VideoSurface12Location.w;
    if (numrects < 1) {
      uVar9 = 0;
    }
    for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
      SVar1 = rects12[uVar11];
      auVar13._8_8_ = 0;
      auVar13._0_2_ = SVar1.x;
      auVar13._2_2_ = SVar1.y;
      auVar13._4_2_ = SVar1.w;
      auVar13._6_2_ = SVar1.h;
      auVar15 = pshuflw(in_XMM1,auVar13,0x60);
      local_58.x = auVar15._0_4_ >> 0x10;
      local_58.y = auVar15._4_4_ >> 0x10;
      auVar2._8_4_ = 0;
      auVar2._0_2_ = SVar1.x;
      auVar2._2_2_ = SVar1.y;
      auVar2._4_2_ = SVar1.w;
      auVar2._6_2_ = SVar1.h;
      auVar2._12_2_ = SVar1.h;
      auVar3._8_2_ = SVar1.w;
      auVar3._0_2_ = SVar1.x;
      auVar3._2_2_ = SVar1.y;
      auVar3._4_2_ = SVar1.w;
      auVar3._6_2_ = SVar1.h;
      auVar3._10_4_ = auVar2._10_4_;
      local_58._8_8_ = ZEXT68(auVar3._8_6_);
      (*SDL20_IntersectRect)(&local_58,&local_40,&intersected20);
      (*OpenGLFuncs.glTexSubImage2D)
                (0xde1,0,intersected20.x,intersected20.y,intersected20.w,intersected20.h,
                 (uVar6 == 4) + 0x1907,GVar8,
                 (GLvoid *)
                 ((long)VideoSurface12Location.pixels +
                 (long)(int)(intersected20.x * uVar6) + (long)intersected20.y * uVar7));
      (*OpenGLFuncs.glBegin)(5);
      iVar5 = intersected20.y;
      iVar4 = intersected20.x;
      auVar14._0_4_ = (float)VideoSurface12Location.w;
      fVar21 = (float)VideoSurface12Location.h;
      auVar19._0_4_ = (float)intersected20.x;
      auVar19._4_4_ = (float)intersected20.w;
      auVar19._8_8_ = 0;
      auVar14._4_4_ = auVar14._0_4_;
      auVar14._8_4_ = auVar14._0_4_;
      auVar14._12_4_ = auVar14._0_4_;
      auVar15 = divps(auVar19,auVar14);
      fVar17 = auVar15._0_4_;
      fVar20 = auVar15._4_4_ + fVar17;
      auVar16._0_4_ = (float)intersected20.y;
      auVar16._4_4_ = (float)intersected20.h;
      auVar16._8_8_ = 0;
      auVar15._4_4_ = fVar21;
      auVar15._0_4_ = fVar21;
      auVar15._8_4_ = fVar21;
      auVar15._12_4_ = fVar21;
      auVar15 = divps(auVar16,auVar15);
      fVar21 = auVar15._0_4_;
      fVar18 = auVar15._4_4_ + fVar21;
      iVar12 = intersected20.w + intersected20.x;
      iVar10 = intersected20.h + intersected20.y;
      (*OpenGLFuncs.glTexCoord2f)(fVar17,fVar21);
      (*OpenGLFuncs.glVertex2i)(iVar4,iVar5);
      (*OpenGLFuncs.glTexCoord2f)(fVar20,fVar21);
      (*OpenGLFuncs.glVertex2i)(iVar12,iVar5);
      (*OpenGLFuncs.glTexCoord2f)(fVar17,fVar18);
      (*OpenGLFuncs.glVertex2i)(iVar4,iVar10);
      (*OpenGLFuncs.glTexCoord2f)(fVar20,fVar18);
      (*OpenGLFuncs.glVertex2i)(iVar12,iVar10);
      (*OpenGLFuncs.glEnd)();
      in_XMM1._8_8_ = extraout_XMM1_Qb;
      in_XMM1._0_8_ = extraout_XMM1_Qa;
    }
  }
  return;
}

Assistant:

SDLCALL
SDL_GL_UpdateRects(int numrects, SDL12_Rect *rects12)
{
    if (OpenGLBlitTexture) {
        const int srcpitch = VideoSurface12->pitch;
        const int pixsize = VideoSurface12->format->BytesPerPixel;
        const GLenum glfmt = (pixsize == 4) ? GL_RGBA : GL_RGB;
        const GLenum gltype = (pixsize == 4) ? GL_UNSIGNED_BYTE : GL_UNSIGNED_SHORT_5_6_5;
        SDL_Rect surfacerect20;
        int i;

        surfacerect20.x = surfacerect20.y = 0;
        surfacerect20.w = VideoSurface12->w;
        surfacerect20.h = VideoSurface12->h;

        for (i = 0; i < numrects; i++) {
            SDL_Rect rect20;
            SDL_Rect intersected20;
            Uint8 *src;

            SDL20_IntersectRect(Rect12to20(&rects12[i], &rect20), &surfacerect20, &intersected20);

            src = (((Uint8 *) VideoSurface12->pixels) + (intersected20.y * srcpitch)) + (intersected20.x * pixsize);
            OpenGLFuncs.glTexSubImage2D(GL_TEXTURE_2D, 0, intersected20.x, intersected20.y, intersected20.w, intersected20.h, glfmt, gltype, src);

            OpenGLFuncs.glBegin(GL_TRIANGLE_STRIP);
            {
                const GLfloat tex_x1 = ((GLfloat) intersected20.x) / ((GLfloat) VideoSurface12->w);
                const GLfloat tex_y1 = ((GLfloat) intersected20.y) / ((GLfloat) VideoSurface12->h);
                const GLfloat tex_x2 = tex_x1 + ((GLfloat) intersected20.w) / ((GLfloat) VideoSurface12->w);
                const GLfloat tex_y2 = tex_y1 + ((GLfloat) intersected20.h) / ((GLfloat) VideoSurface12->h);
                const GLint vert_x1 = (GLint) intersected20.x;
                const GLint vert_y1 = (GLint) intersected20.y;
                const GLint vert_x2 = vert_x1 + (GLint) intersected20.w;
                const GLint vert_y2 = vert_y1 + (GLint) intersected20.h;
                OpenGLFuncs.glTexCoord2f(tex_x1, tex_y1);
                OpenGLFuncs.glVertex2i(vert_x1, vert_y1);
                OpenGLFuncs.glTexCoord2f(tex_x2, tex_y1);
                OpenGLFuncs.glVertex2i(vert_x2, vert_y1);
                OpenGLFuncs.glTexCoord2f(tex_x1, tex_y2);
                OpenGLFuncs.glVertex2i(vert_x1, vert_y2);
                OpenGLFuncs.glTexCoord2f(tex_x2, tex_y2);
                OpenGLFuncs.glVertex2i(vert_x2, vert_y2);
            }
            OpenGLFuncs.glEnd();
        }
    }
}